

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,
         SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short in_SI;
  short in_DI;
  short ret;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_short *in_stack_ffffffffffffffe8;
  ushort in_stack_fffffffffffffff0;
  undefined2 uVar3;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  short local_6;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  unsigned_short local_2;
  
  local_6 = in_DI;
  local_4.m_int = in_SI;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_8);
  SVar4.m_int = local_4.m_int;
  bVar1 = DivisionCornerCaseHelper<unsigned_short,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1(local_6,local_4,&local_8);
  if (bVar1) {
    local_2 = local_8.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_short,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
            ::DivisionCornerCase2(local_6,local_4,&local_8);
    if (bVar1) {
      local_2 = local_8.m_int;
    }
    else {
      uVar3 = 0;
      uVar2 = SafeInt::operator_cast_to_unsigned_short
                        ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>
                          *)CONCAT26(SVar4.m_int,
                                     CONCAT24(local_4.m_int,(uint)in_stack_fffffffffffffff0)));
      DivisionHelper<short,_unsigned_short,_4>::
      DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
                ((short *)CONCAT26(SVar4.m_int,CONCAT24(local_4.m_int,CONCAT22(uVar3,uVar2))),
                 in_stack_ffffffffffffffe8,(short *)0x169f1e);
      SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
                ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT26(SVar4.m_int,CONCAT24(local_4.m_int,CONCAT22(uVar3,uVar2))),
                 (short *)in_stack_ffffffffffffffe8);
    }
  }
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}